

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

bool __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
           *this,timer_object_holder<timertt::thread_safety::unsafe> *timer,
          duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  reference_counter_type *prVar1;
  undefined8 *puVar2;
  timer_type *ptVar3;
  ulong uVar4;
  uint uVar5;
  timer_type *timer_00;
  long lVar6;
  uint uVar7;
  rep g_units;
  rep d_units;
  
  timer_00 = timer_object_holder<timertt::thread_safety::unsafe>::
             cast_to<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                       (timer);
  timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::ensure_timer_deactivated(timer_00);
  std::function<void_()>::operator=(&timer_00->m_action,action);
  prVar1 = &(timer_00->super_timer_object<timertt::thread_safety::unsafe>).m_references;
  *prVar1 = *prVar1 + 1;
  *(undefined4 *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
  lVar6 = *(long *)(this + 0x58);
  uVar7 = (uint)((pause.__r + lVar6 / 2) / lVar6);
  if (uVar7 < 2) {
    uVar7 = 1;
  }
  uVar5 = *(uint *)(this + 0x50);
  uVar4 = (ulong)(*(int *)(this + 0x60) + uVar7) % (ulong)uVar5;
  timer_00->m_position = (uint)uVar4;
  timer_00->m_full_rolls_left = uVar7 / uVar5;
  uVar7 = 0;
  if (period.__r != 0) {
    uVar5 = (uint)((lVar6 / 2 + period.__r) / lVar6);
    uVar7 = 1;
    if (1 < uVar5) {
      uVar7 = uVar5;
    }
  }
  timer_00->m_period = uVar7;
  lVar6 = uVar4 * 0x10;
  puVar2 = (undefined8 *)(*(long *)(this + 0x78) + lVar6);
  if (*(long *)(*(long *)(this + 0x78) + lVar6) == 0) {
    timer_00->m_prev = (timer_type *)0x0;
    timer_00->m_next = (timer_type *)0x0;
    *puVar2 = timer_00;
  }
  else {
    ptVar3 = (timer_type *)puVar2[1];
    timer_00->m_prev = ptVar3;
    timer_00->m_next = (timer_type *)0x0;
    ptVar3->m_next = timer_00;
  }
  puVar2[1] = timer_00;
  *(long *)(this + (ulong)(timer_00->m_period != 0) * 8 + 0x40) =
       *(long *)(this + (ulong)(timer_00->m_period != 0) * 8 + 0x40) + 1;
  return *(long *)(this + 0x48) + *(long *)(this + 0x40) == 1;
}

Assistant:

bool
	activate(
		//! Timer to be activated.
		timer_object_holder< THREAD_SAFETY > timer,
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		auto * wheel_timer = timer.template cast_to< timer_type >();
		ensure_timer_deactivated( wheel_timer );

		wheel_timer->m_action = std::move(action);

		// Timer must be taken under control.
		timer_object< THREAD_SAFETY >::increment_references( wheel_timer );
		// It is an active timer now.
		wheel_timer->m_status = timer_status::active;

		// Calculate the demand position in the wheel.
		set_position_in_the_wheel(
				wheel_timer,
				duration_to_ticks( pause ) );

		// Special calculations for the periodic demand.
		if( monotonic_clock::duration::zero() != period )
			wheel_timer->m_period = duration_to_ticks( period );
		else
			wheel_timer->m_period = 0;

		insert_demand_to_wheel( wheel_timer );

		// Count of timers changed.
		this->inc_timer_count( wheel_timer->kind() );

		// If wheel was empty and this is the first timer added
		// the value of timer_count must be exactly 1.
		return 1 == this->m_timer_quantities.m_single_shot_count +
				this->m_timer_quantities.m_periodic_count;
	}